

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O0

void __thiscall wasm::InstrumentMemory::visitModule(InstrumentMemory *this,Module *curr)

{
  initializer_list<wasm::Type> types;
  Name name;
  initializer_list<wasm::Type> types_00;
  Name name_00;
  initializer_list<wasm::Type> types_01;
  Name name_01;
  initializer_list<wasm::Type> types_02;
  Name name_02;
  initializer_list<wasm::Type> types_03;
  Name name_03;
  initializer_list<wasm::Type> types_04;
  Name name_04;
  initializer_list<wasm::Type> types_05;
  Name name_05;
  initializer_list<wasm::Type> types_06;
  Name name_06;
  initializer_list<wasm::Type> types_07;
  Name name_07;
  initializer_list<wasm::Type> types_08;
  Name name_08;
  initializer_list<wasm::Type> types_09;
  Name name_09;
  initializer_list<wasm::Type> types_10;
  Name name_10;
  initializer_list<wasm::Type> types_11;
  Name name_11;
  initializer_list<wasm::Type> types_12;
  Name name_12;
  initializer_list<wasm::Type> types_13;
  Name name_13;
  initializer_list<wasm::Type> types_14;
  Name name_14;
  initializer_list<wasm::Type> types_15;
  Name name_15;
  initializer_list<wasm::Type> types_16;
  Name name_16;
  initializer_list<wasm::Type> types_17;
  Name name_17;
  initializer_list<wasm::Type> types_18;
  Name name_18;
  initializer_list<wasm::Type> types_19;
  Name name_19;
  initializer_list<wasm::Type> types_20;
  Name name_20;
  initializer_list<wasm::Type> types_21;
  Name name_21;
  initializer_list<wasm::Type> types_22;
  Name name_22;
  initializer_list<wasm::Type> types_23;
  Name name_23;
  initializer_list<wasm::Type> types_24;
  Name name_24;
  initializer_list<wasm::Type> types_25;
  Name name_25;
  initializer_list<wasm::Type> types_26;
  Name name_26;
  Type TVar1;
  bool bVar2;
  reference this_00;
  pointer pMVar3;
  Type local_740;
  Type local_738;
  Type TStack_730;
  iterator local_728;
  undefined8 local_720;
  Type local_718;
  size_t local_710;
  char *local_708;
  Type local_700;
  Type local_6f8;
  Type TStack_6f0;
  iterator local_6e8;
  undefined8 local_6e0;
  Type local_6d8;
  size_t local_6d0;
  char *local_6c8;
  Type local_6c0;
  Type local_6b8;
  Type TStack_6b0;
  iterator local_6a8;
  undefined8 local_6a0;
  Type local_698;
  size_t local_690;
  char *local_688;
  Type local_680;
  Type local_678;
  Type TStack_670;
  iterator local_668;
  undefined8 local_660;
  Type local_658;
  size_t local_650;
  char *local_648;
  Type local_640;
  Type local_638;
  Type TStack_630;
  iterator local_628;
  undefined8 local_620;
  Type local_618;
  size_t local_610;
  char *local_608;
  Type local_600;
  Type local_5f8;
  Type TStack_5f0;
  iterator local_5e8;
  undefined8 local_5e0;
  Type local_5d8;
  size_t local_5d0;
  char *local_5c8;
  Type local_5c0;
  Type local_5b8;
  Type TStack_5b0;
  iterator local_5a8;
  undefined8 local_5a0;
  Type local_598;
  size_t local_590;
  char *local_588;
  Type local_580;
  Type local_578;
  Type TStack_570;
  iterator local_568;
  undefined8 local_560;
  Type local_558;
  size_t local_550;
  char *local_548;
  Type local_540;
  Type local_538;
  Type TStack_530;
  iterator local_528;
  undefined8 local_520;
  Type local_518;
  size_t local_510;
  char *local_508;
  Type local_500;
  Type local_4f8;
  Type TStack_4f0;
  iterator local_4e8;
  undefined8 local_4e0;
  Type local_4d8;
  size_t local_4d0;
  char *local_4c8;
  Type local_4c0;
  Type local_4b8;
  Type TStack_4b0;
  iterator local_4a8;
  undefined8 local_4a0;
  Type local_498;
  size_t local_490;
  char *local_488;
  Type local_480;
  Type local_478;
  Type TStack_470;
  iterator local_468;
  undefined8 local_460;
  Type local_458;
  size_t local_450;
  char *local_448;
  Type local_440;
  Type local_438;
  Type TStack_430;
  iterator local_428;
  undefined8 local_420;
  Type local_418;
  size_t local_410;
  char *local_408;
  Type local_400;
  Type local_3f8;
  Type TStack_3f0;
  iterator local_3e8;
  undefined8 local_3e0;
  Type local_3d8;
  size_t local_3d0;
  char *local_3c8;
  Type local_3c0;
  Type local_3b8;
  Type TStack_3b0;
  iterator local_3a8;
  undefined8 local_3a0;
  Type local_398;
  size_t local_390;
  char *local_388;
  Type local_380;
  Type local_378;
  Type TStack_370;
  iterator local_368;
  undefined8 local_360;
  Type local_358;
  size_t local_350;
  char *local_348;
  Type local_340;
  Type local_338;
  Type TStack_330;
  iterator local_328;
  undefined8 local_320;
  Type local_318;
  size_t local_310;
  char *local_308;
  Type local_300;
  Type local_2f8;
  Type TStack_2f0;
  iterator local_2e8;
  undefined8 local_2e0;
  Type local_2d8;
  size_t local_2d0;
  char *local_2c8;
  Type local_2c0;
  Type local_2b8;
  Type TStack_2b0;
  iterator local_2a8;
  undefined8 local_2a0;
  Type local_298;
  size_t local_290;
  char *local_288;
  Type local_280;
  Type local_278;
  Type TStack_270;
  iterator local_268;
  undefined8 local_260;
  Type local_258;
  size_t local_250;
  char *local_248;
  Type local_240;
  Type local_238;
  Type TStack_230;
  iterator local_228;
  undefined8 local_220;
  Type local_218;
  size_t local_210;
  char *local_208;
  Type local_200;
  Type local_1f8;
  Type TStack_1f0;
  iterator local_1e8;
  undefined8 local_1e0;
  Type local_1d8;
  size_t local_1d0;
  char *local_1c8;
  uintptr_t local_1c0;
  Type local_1b8;
  Type TStack_1b0;
  uintptr_t local_1a8;
  uintptr_t local_1a0;
  iterator local_198;
  undefined8 local_190;
  Type local_188;
  size_t local_180;
  char *local_178;
  Type local_170;
  Type local_168;
  Type TStack_160;
  iterator local_158;
  undefined8 local_150;
  Type local_148;
  size_t local_140;
  char *local_138;
  Type local_130;
  Type local_128;
  Type TStack_120;
  iterator local_118;
  undefined8 local_110;
  Type local_108;
  size_t local_100;
  char *local_f8;
  Type local_f0;
  Type local_e8;
  Type TStack_e0;
  iterator local_d8;
  undefined8 local_d0;
  Type local_c8;
  size_t local_c0;
  char *local_b8;
  Type local_b0;
  Type local_a8;
  Type TStack_a0;
  iterator local_98;
  undefined8 local_90;
  Type local_88;
  size_t local_80;
  char *local_78;
  uintptr_t local_70;
  Type local_68;
  Type TStack_60;
  uintptr_t local_58;
  uintptr_t local_50;
  iterator local_48;
  undefined8 local_40;
  Type local_38;
  size_t local_30;
  char *local_28;
  Type local_20;
  Type addressType;
  Module *curr_local;
  InstrumentMemory *this_local;
  
  addressType.id = (uintptr_t)curr;
  bVar2 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty(&curr->memories);
  if (bVar2) {
    wasm::Type::Type(&local_20,i32);
  }
  else {
    this_00 = std::
              vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                            *)(addressType.id + 0x78),0);
    pMVar3 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(this_00);
    local_20.id = (pMVar3->addressType).id;
  }
  TVar1.id = addressType.id;
  local_30 = load_ptr;
  local_28 = DAT_03193820;
  wasm::Type::Type(&local_68,i32);
  wasm::Type::Type(&TStack_60,i32);
  local_58 = local_20.id;
  local_50 = local_20.id;
  local_48 = &local_68;
  local_40 = 4;
  types_26._M_len = 4;
  types_26._M_array = local_48;
  wasm::Type::Type(&local_38,types_26);
  local_70 = local_20.id;
  name_26.super_IString.str._M_str = local_28;
  name_26.super_IString.str._M_len = local_30;
  addImport(this,(Module *)TVar1.id,name_26,local_38,local_20);
  TVar1 = addressType;
  local_80 = load_val_i32;
  local_78 = DAT_03193830;
  wasm::Type::Type(&local_a8,i32);
  wasm::Type::Type(&TStack_a0,i32);
  local_98 = &local_a8;
  local_90 = 2;
  types_25._M_len = 2;
  types_25._M_array = local_98;
  wasm::Type::Type(&local_88,types_25);
  wasm::Type::Type(&local_b0,i32);
  name_25.super_IString.str._M_str = local_78;
  name_25.super_IString.str._M_len = local_80;
  addImport(this,(Module *)TVar1.id,name_25,local_88,local_b0);
  TVar1 = addressType;
  local_c0 = load_val_i64;
  local_b8 = DAT_03193840;
  wasm::Type::Type(&local_e8,i32);
  wasm::Type::Type(&TStack_e0,i64);
  local_d8 = &local_e8;
  local_d0 = 2;
  types_24._M_len = 2;
  types_24._M_array = local_d8;
  wasm::Type::Type(&local_c8,types_24);
  wasm::Type::Type(&local_f0,i64);
  name_24.super_IString.str._M_str = local_b8;
  name_24.super_IString.str._M_len = local_c0;
  addImport(this,(Module *)TVar1.id,name_24,local_c8,local_f0);
  TVar1 = addressType;
  local_100 = load_val_f32;
  local_f8 = DAT_03193850;
  wasm::Type::Type(&local_128,i32);
  wasm::Type::Type(&TStack_120,f32);
  local_118 = &local_128;
  local_110 = 2;
  types_23._M_len = 2;
  types_23._M_array = local_118;
  wasm::Type::Type(&local_108,types_23);
  wasm::Type::Type(&local_130,f32);
  name_23.super_IString.str._M_str = local_f8;
  name_23.super_IString.str._M_len = local_100;
  addImport(this,(Module *)TVar1.id,name_23,local_108,local_130);
  TVar1 = addressType;
  local_140 = load_val_f64;
  local_138 = DAT_03193860;
  wasm::Type::Type(&local_168,i32);
  wasm::Type::Type(&TStack_160,f64);
  local_158 = &local_168;
  local_150 = 2;
  types_22._M_len = 2;
  types_22._M_array = local_158;
  wasm::Type::Type(&local_148,types_22);
  wasm::Type::Type(&local_170,f64);
  name_22.super_IString.str._M_str = local_138;
  name_22.super_IString.str._M_len = local_140;
  addImport(this,(Module *)TVar1.id,name_22,local_148,local_170);
  TVar1 = addressType;
  local_180 = store_ptr;
  local_178 = DAT_03193870;
  wasm::Type::Type(&local_1b8,i32);
  wasm::Type::Type(&TStack_1b0,i32);
  local_1a8 = local_20.id;
  local_1a0 = local_20.id;
  local_198 = &local_1b8;
  local_190 = 4;
  types_21._M_len = 4;
  types_21._M_array = local_198;
  wasm::Type::Type(&local_188,types_21);
  local_1c0 = local_20.id;
  name_21.super_IString.str._M_str = local_178;
  name_21.super_IString.str._M_len = local_180;
  addImport(this,(Module *)TVar1.id,name_21,local_188,local_20);
  TVar1 = addressType;
  local_1d0 = store_val_i32;
  local_1c8 = DAT_03193880;
  wasm::Type::Type(&local_1f8,i32);
  wasm::Type::Type(&TStack_1f0,i32);
  local_1e8 = &local_1f8;
  local_1e0 = 2;
  types_20._M_len = 2;
  types_20._M_array = local_1e8;
  wasm::Type::Type(&local_1d8,types_20);
  wasm::Type::Type(&local_200,i32);
  name_20.super_IString.str._M_str = local_1c8;
  name_20.super_IString.str._M_len = local_1d0;
  addImport(this,(Module *)TVar1.id,name_20,local_1d8,local_200);
  TVar1 = addressType;
  local_210 = store_val_i64;
  local_208 = DAT_03193890;
  wasm::Type::Type(&local_238,i32);
  wasm::Type::Type(&TStack_230,i64);
  local_228 = &local_238;
  local_220 = 2;
  types_19._M_len = 2;
  types_19._M_array = local_228;
  wasm::Type::Type(&local_218,types_19);
  wasm::Type::Type(&local_240,i64);
  name_19.super_IString.str._M_str = local_208;
  name_19.super_IString.str._M_len = local_210;
  addImport(this,(Module *)TVar1.id,name_19,local_218,local_240);
  TVar1 = addressType;
  local_250 = store_val_f32;
  local_248 = DAT_031938a0;
  wasm::Type::Type(&local_278,i32);
  wasm::Type::Type(&TStack_270,f32);
  local_268 = &local_278;
  local_260 = 2;
  types_18._M_len = 2;
  types_18._M_array = local_268;
  wasm::Type::Type(&local_258,types_18);
  wasm::Type::Type(&local_280,f32);
  name_18.super_IString.str._M_str = local_248;
  name_18.super_IString.str._M_len = local_250;
  addImport(this,(Module *)TVar1.id,name_18,local_258,local_280);
  TVar1 = addressType;
  local_290 = store_val_f64;
  local_288 = DAT_031938b0;
  wasm::Type::Type(&local_2b8,i32);
  wasm::Type::Type(&TStack_2b0,f64);
  local_2a8 = &local_2b8;
  local_2a0 = 2;
  types_17._M_len = 2;
  types_17._M_array = local_2a8;
  wasm::Type::Type(&local_298,types_17);
  wasm::Type::Type(&local_2c0,f64);
  name_17.super_IString.str._M_str = local_288;
  name_17.super_IString.str._M_len = local_290;
  addImport(this,(Module *)TVar1.id,name_17,local_298,local_2c0);
  bVar2 = FeatureSet::hasGC((FeatureSet *)(addressType.id + 0x178));
  TVar1 = addressType;
  if (bVar2) {
    local_2d0 = struct_get_val_i32;
    local_2c8 = DAT_031938c0;
    wasm::Type::Type(&local_2f8,i32);
    wasm::Type::Type(&TStack_2f0,i32);
    local_2e8 = &local_2f8;
    local_2e0 = 2;
    types_16._M_len = 2;
    types_16._M_array = local_2e8;
    wasm::Type::Type(&local_2d8,types_16);
    wasm::Type::Type(&local_300,i32);
    name_16.super_IString.str._M_str = local_2c8;
    name_16.super_IString.str._M_len = local_2d0;
    addImport(this,(Module *)TVar1.id,name_16,local_2d8,local_300);
    TVar1 = addressType;
    local_310 = struct_get_val_i64;
    local_308 = DAT_031938d0;
    wasm::Type::Type(&local_338,i32);
    wasm::Type::Type(&TStack_330,i64);
    local_328 = &local_338;
    local_320 = 2;
    types_15._M_len = 2;
    types_15._M_array = local_328;
    wasm::Type::Type(&local_318,types_15);
    wasm::Type::Type(&local_340,i64);
    name_15.super_IString.str._M_str = local_308;
    name_15.super_IString.str._M_len = local_310;
    addImport(this,(Module *)TVar1.id,name_15,local_318,local_340);
    TVar1 = addressType;
    local_350 = struct_get_val_f32;
    local_348 = DAT_031938e0;
    wasm::Type::Type(&local_378,i32);
    wasm::Type::Type(&TStack_370,f32);
    local_368 = &local_378;
    local_360 = 2;
    types_14._M_len = 2;
    types_14._M_array = local_368;
    wasm::Type::Type(&local_358,types_14);
    wasm::Type::Type(&local_380,f32);
    name_14.super_IString.str._M_str = local_348;
    name_14.super_IString.str._M_len = local_350;
    addImport(this,(Module *)TVar1.id,name_14,local_358,local_380);
    TVar1 = addressType;
    local_390 = struct_get_val_f64;
    local_388 = DAT_031938f0;
    wasm::Type::Type(&local_3b8,i32);
    wasm::Type::Type(&TStack_3b0,f64);
    local_3a8 = &local_3b8;
    local_3a0 = 2;
    types_13._M_len = 2;
    types_13._M_array = local_3a8;
    wasm::Type::Type(&local_398,types_13);
    wasm::Type::Type(&local_3c0,f64);
    name_13.super_IString.str._M_str = local_388;
    name_13.super_IString.str._M_len = local_390;
    addImport(this,(Module *)TVar1.id,name_13,local_398,local_3c0);
    TVar1 = addressType;
    local_3d0 = struct_set_val_i32;
    local_3c8 = DAT_03193900;
    wasm::Type::Type(&local_3f8,i32);
    wasm::Type::Type(&TStack_3f0,i32);
    local_3e8 = &local_3f8;
    local_3e0 = 2;
    types_12._M_len = 2;
    types_12._M_array = local_3e8;
    wasm::Type::Type(&local_3d8,types_12);
    wasm::Type::Type(&local_400,i32);
    name_12.super_IString.str._M_str = local_3c8;
    name_12.super_IString.str._M_len = local_3d0;
    addImport(this,(Module *)TVar1.id,name_12,local_3d8,local_400);
    TVar1 = addressType;
    local_410 = struct_set_val_i64;
    local_408 = DAT_03193910;
    wasm::Type::Type(&local_438,i32);
    wasm::Type::Type(&TStack_430,i64);
    local_428 = &local_438;
    local_420 = 2;
    types_11._M_len = 2;
    types_11._M_array = local_428;
    wasm::Type::Type(&local_418,types_11);
    wasm::Type::Type(&local_440,i64);
    name_11.super_IString.str._M_str = local_408;
    name_11.super_IString.str._M_len = local_410;
    addImport(this,(Module *)TVar1.id,name_11,local_418,local_440);
    TVar1 = addressType;
    local_450 = struct_set_val_f32;
    local_448 = DAT_03193920;
    wasm::Type::Type(&local_478,i32);
    wasm::Type::Type(&TStack_470,f32);
    local_468 = &local_478;
    local_460 = 2;
    types_10._M_len = 2;
    types_10._M_array = local_468;
    wasm::Type::Type(&local_458,types_10);
    wasm::Type::Type(&local_480,f32);
    name_10.super_IString.str._M_str = local_448;
    name_10.super_IString.str._M_len = local_450;
    addImport(this,(Module *)TVar1.id,name_10,local_458,local_480);
    TVar1 = addressType;
    local_490 = struct_set_val_f64;
    local_488 = DAT_03193930;
    wasm::Type::Type(&local_4b8,i32);
    wasm::Type::Type(&TStack_4b0,f64);
    local_4a8 = &local_4b8;
    local_4a0 = 2;
    types_09._M_len = 2;
    types_09._M_array = local_4a8;
    wasm::Type::Type(&local_498,types_09);
    wasm::Type::Type(&local_4c0,f64);
    name_09.super_IString.str._M_str = local_488;
    name_09.super_IString.str._M_len = local_490;
    addImport(this,(Module *)TVar1.id,name_09,local_498,local_4c0);
    TVar1 = addressType;
    local_4d0 = array_get_val_i32;
    local_4c8 = DAT_03193940;
    wasm::Type::Type(&local_4f8,i32);
    wasm::Type::Type(&TStack_4f0,i32);
    local_4e8 = &local_4f8;
    local_4e0 = 2;
    types_08._M_len = 2;
    types_08._M_array = local_4e8;
    wasm::Type::Type(&local_4d8,types_08);
    wasm::Type::Type(&local_500,i32);
    name_08.super_IString.str._M_str = local_4c8;
    name_08.super_IString.str._M_len = local_4d0;
    addImport(this,(Module *)TVar1.id,name_08,local_4d8,local_500);
    TVar1 = addressType;
    local_510 = array_get_val_i64;
    local_508 = DAT_03193950;
    wasm::Type::Type(&local_538,i32);
    wasm::Type::Type(&TStack_530,i64);
    local_528 = &local_538;
    local_520 = 2;
    types_07._M_len = 2;
    types_07._M_array = local_528;
    wasm::Type::Type(&local_518,types_07);
    wasm::Type::Type(&local_540,i64);
    name_07.super_IString.str._M_str = local_508;
    name_07.super_IString.str._M_len = local_510;
    addImport(this,(Module *)TVar1.id,name_07,local_518,local_540);
    TVar1 = addressType;
    local_550 = array_get_val_f32;
    local_548 = DAT_03193960;
    wasm::Type::Type(&local_578,i32);
    wasm::Type::Type(&TStack_570,f32);
    local_568 = &local_578;
    local_560 = 2;
    types_06._M_len = 2;
    types_06._M_array = local_568;
    wasm::Type::Type(&local_558,types_06);
    wasm::Type::Type(&local_580,f32);
    name_06.super_IString.str._M_str = local_548;
    name_06.super_IString.str._M_len = local_550;
    addImport(this,(Module *)TVar1.id,name_06,local_558,local_580);
    TVar1 = addressType;
    local_590 = array_get_val_f64;
    local_588 = DAT_03193970;
    wasm::Type::Type(&local_5b8,i32);
    wasm::Type::Type(&TStack_5b0,f64);
    local_5a8 = &local_5b8;
    local_5a0 = 2;
    types_05._M_len = 2;
    types_05._M_array = local_5a8;
    wasm::Type::Type(&local_598,types_05);
    wasm::Type::Type(&local_5c0,f64);
    name_05.super_IString.str._M_str = local_588;
    name_05.super_IString.str._M_len = local_590;
    addImport(this,(Module *)TVar1.id,name_05,local_598,local_5c0);
    TVar1 = addressType;
    local_5d0 = array_set_val_i32;
    local_5c8 = DAT_03193980;
    wasm::Type::Type(&local_5f8,i32);
    wasm::Type::Type(&TStack_5f0,i32);
    local_5e8 = &local_5f8;
    local_5e0 = 2;
    types_04._M_len = 2;
    types_04._M_array = local_5e8;
    wasm::Type::Type(&local_5d8,types_04);
    wasm::Type::Type(&local_600,i32);
    name_04.super_IString.str._M_str = local_5c8;
    name_04.super_IString.str._M_len = local_5d0;
    addImport(this,(Module *)TVar1.id,name_04,local_5d8,local_600);
    TVar1 = addressType;
    local_610 = array_set_val_i64;
    local_608 = DAT_03193990;
    wasm::Type::Type(&local_638,i32);
    wasm::Type::Type(&TStack_630,i64);
    local_628 = &local_638;
    local_620 = 2;
    types_03._M_len = 2;
    types_03._M_array = local_628;
    wasm::Type::Type(&local_618,types_03);
    wasm::Type::Type(&local_640,i64);
    name_03.super_IString.str._M_str = local_608;
    name_03.super_IString.str._M_len = local_610;
    addImport(this,(Module *)TVar1.id,name_03,local_618,local_640);
    TVar1 = addressType;
    local_650 = array_set_val_f32;
    local_648 = DAT_031939a0;
    wasm::Type::Type(&local_678,i32);
    wasm::Type::Type(&TStack_670,f32);
    local_668 = &local_678;
    local_660 = 2;
    types_02._M_len = 2;
    types_02._M_array = local_668;
    wasm::Type::Type(&local_658,types_02);
    wasm::Type::Type(&local_680,f32);
    name_02.super_IString.str._M_str = local_648;
    name_02.super_IString.str._M_len = local_650;
    addImport(this,(Module *)TVar1.id,name_02,local_658,local_680);
    TVar1 = addressType;
    local_690 = array_set_val_f64;
    local_688 = DAT_031939b0;
    wasm::Type::Type(&local_6b8,i32);
    wasm::Type::Type(&TStack_6b0,f64);
    local_6a8 = &local_6b8;
    local_6a0 = 2;
    types_01._M_len = 2;
    types_01._M_array = local_6a8;
    wasm::Type::Type(&local_698,types_01);
    wasm::Type::Type(&local_6c0,f64);
    name_01.super_IString.str._M_str = local_688;
    name_01.super_IString.str._M_len = local_690;
    addImport(this,(Module *)TVar1.id,name_01,local_698,local_6c0);
    TVar1 = addressType;
    local_6d0 = array_get_index;
    local_6c8 = DAT_031939c0;
    wasm::Type::Type(&local_6f8,i32);
    wasm::Type::Type(&TStack_6f0,i32);
    local_6e8 = &local_6f8;
    local_6e0 = 2;
    types_00._M_len = 2;
    types_00._M_array = local_6e8;
    wasm::Type::Type(&local_6d8,types_00);
    wasm::Type::Type(&local_700,i32);
    name_00.super_IString.str._M_str = local_6c8;
    name_00.super_IString.str._M_len = local_6d0;
    addImport(this,(Module *)TVar1.id,name_00,local_6d8,local_700);
    TVar1 = addressType;
    local_710 = array_set_index;
    local_708 = DAT_031939d0;
    wasm::Type::Type(&local_738,i32);
    wasm::Type::Type(&TStack_730,i32);
    local_728 = &local_738;
    local_720 = 2;
    types._M_len = 2;
    types._M_array = local_728;
    wasm::Type::Type(&local_718,types);
    wasm::Type::Type(&local_740,i32);
    name.super_IString.str._M_str = local_708;
    name.super_IString.str._M_len = local_710;
    addImport(this,(Module *)TVar1.id,name,local_718,local_740);
  }
  return;
}

Assistant:

void visitModule(Module* curr) {
    auto addressType =
      curr->memories.empty() ? Type::i32 : curr->memories[0]->addressType;

    // Load.
    addImport(curr,
              load_ptr,
              {Type::i32, Type::i32, addressType, addressType},
              addressType);
    addImport(curr, load_val_i32, {Type::i32, Type::i32}, Type::i32);
    addImport(curr, load_val_i64, {Type::i32, Type::i64}, Type::i64);
    addImport(curr, load_val_f32, {Type::i32, Type::f32}, Type::f32);
    addImport(curr, load_val_f64, {Type::i32, Type::f64}, Type::f64);

    // Store.
    addImport(curr,
              store_ptr,
              {Type::i32, Type::i32, addressType, addressType},
              addressType);
    addImport(curr, store_val_i32, {Type::i32, Type::i32}, Type::i32);
    addImport(curr, store_val_i64, {Type::i32, Type::i64}, Type::i64);
    addImport(curr, store_val_f32, {Type::i32, Type::f32}, Type::f32);
    addImport(curr, store_val_f64, {Type::i32, Type::f64}, Type::f64);

    if (curr->features.hasGC()) {
      // Struct get/set.
      addImport(curr, struct_get_val_i32, {Type::i32, Type::i32}, Type::i32);
      addImport(curr, struct_get_val_i64, {Type::i32, Type::i64}, Type::i64);
      addImport(curr, struct_get_val_f32, {Type::i32, Type::f32}, Type::f32);
      addImport(curr, struct_get_val_f64, {Type::i32, Type::f64}, Type::f64);
      addImport(curr, struct_set_val_i32, {Type::i32, Type::i32}, Type::i32);
      addImport(curr, struct_set_val_i64, {Type::i32, Type::i64}, Type::i64);
      addImport(curr, struct_set_val_f32, {Type::i32, Type::f32}, Type::f32);
      addImport(curr, struct_set_val_f64, {Type::i32, Type::f64}, Type::f64);

      // Array get/set.
      addImport(curr, array_get_val_i32, {Type::i32, Type::i32}, Type::i32);
      addImport(curr, array_get_val_i64, {Type::i32, Type::i64}, Type::i64);
      addImport(curr, array_get_val_f32, {Type::i32, Type::f32}, Type::f32);
      addImport(curr, array_get_val_f64, {Type::i32, Type::f64}, Type::f64);
      addImport(curr, array_set_val_i32, {Type::i32, Type::i32}, Type::i32);
      addImport(curr, array_set_val_i64, {Type::i32, Type::i64}, Type::i64);
      addImport(curr, array_set_val_f32, {Type::i32, Type::f32}, Type::f32);
      addImport(curr, array_set_val_f64, {Type::i32, Type::f64}, Type::f64);
      addImport(curr, array_get_index, {Type::i32, Type::i32}, Type::i32);
      addImport(curr, array_set_index, {Type::i32, Type::i32}, Type::i32);
    }
  }